

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O2

int equation_system_solve(aom_equation_system_t *eqns)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  size_t size;
  undefined8 uVar4;
  uint uVar5;
  double *pdVar6;
  void *__dest;
  void *__dest_00;
  ulong uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  double *pdVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  void *pvVar17;
  void *pvVar18;
  ulong uVar19;
  long lVar20;
  void *pvVar21;
  ulong uVar22;
  double dVar23;
  double dVar24;
  void *local_60;
  
  uVar5 = eqns->n;
  lVar20 = (long)(int)uVar5;
  size = lVar20 * 8;
  __dest = aom_malloc(size);
  __dest_00 = aom_malloc(size * lVar20);
  if ((__dest_00 == (void *)0x0) || (__dest == (void *)0x0)) {
    iVar9 = 0;
    fprintf(_stderr,"Unable to allocate temp values of size %dx%d\n",(ulong)uVar5);
  }
  else {
    memcpy(__dest_00,eqns->A,size * lVar20);
    memcpy(__dest,eqns->b,size);
    uVar7 = (ulong)eqns->n;
    pdVar6 = eqns->x;
    uVar10 = uVar5 - 1;
    uVar19 = 0;
    uVar15 = 0;
    if (0 < (int)uVar5) {
      uVar15 = (ulong)uVar5;
    }
    uVar12 = 0;
    if (0 < (int)uVar10) {
      uVar12 = (ulong)uVar10;
    }
    lVar8 = lVar20 + -1;
    lVar16 = uVar7 * 8;
    local_60 = (void *)((long)__dest_00 + uVar7 * 8);
    pvVar21 = __dest_00;
    for (; lVar13 = lVar8, pvVar18 = (void *)((long)__dest_00 + (lVar20 + -2) * uVar7 * 8),
        pvVar17 = (void *)((long)__dest_00 + lVar8 * uVar7 * 8), uVar19 != uVar12;
        uVar19 = uVar19 + 1) {
      while ((long)uVar19 < lVar13) {
        lVar1 = lVar13 + -1;
        if (ABS(*(double *)((long)__dest_00 + lVar1 * uVar7 * 8 + uVar19 * 8)) <
            ABS(*(double *)((long)__dest_00 + lVar13 * uVar7 * 8 + uVar19 * 8))) {
          for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
            uVar4 = *(undefined8 *)((long)pvVar17 + uVar14 * 8);
            *(undefined8 *)((long)pvVar17 + uVar14 * 8) =
                 *(undefined8 *)((long)pvVar18 + uVar14 * 8);
            *(undefined8 *)((long)pvVar18 + uVar14 * 8) = uVar4;
          }
          puVar2 = (undefined8 *)((long)__dest + lVar1 * 8);
          uVar4 = *puVar2;
          puVar3 = (undefined8 *)((long)__dest + lVar1 * 8);
          *puVar3 = puVar2[1];
          puVar3[1] = uVar4;
        }
        lVar13 = lVar1;
        pvVar18 = (void *)((long)pvVar18 + uVar7 * -8);
        pvVar17 = (void *)((long)pvVar17 + uVar7 * -8);
      }
      uVar14 = uVar19;
      pvVar18 = local_60;
      while (uVar14 != uVar10) {
        dVar24 = *(double *)((long)__dest_00 + uVar19 * 8 + uVar19 * uVar7 * 8);
        if (ABS(dVar24) < 1e-16) goto LAB_00250d0e;
        uVar14 = uVar14 + 1;
        dVar24 = -*(double *)((long)__dest_00 + uVar14 * uVar7 * 8 + uVar19 * 8) / dVar24;
        for (uVar22 = 0; uVar15 != uVar22; uVar22 = uVar22 + 1) {
          *(double *)((long)pvVar18 + uVar22 * 8) =
               *(double *)((long)pvVar21 + uVar22 * 8) * dVar24 +
               *(double *)((long)pvVar18 + uVar22 * 8);
        }
        *(double *)((long)__dest + uVar14 * 8) =
             dVar24 * *(double *)((long)__dest + uVar19 * 8) +
             *(double *)((long)__dest + uVar14 * 8);
        pvVar18 = (void *)((long)pvVar18 + lVar16);
      }
      local_60 = (void *)((long)local_60 + lVar16);
      pvVar21 = (void *)((long)pvVar21 + lVar16);
    }
    pdVar11 = pdVar6 + lVar20;
    lVar20 = size + lVar8 * uVar7 * 8 + (long)__dest_00;
    iVar9 = 1;
    for (; -1 < lVar8; lVar8 = lVar8 + -1) {
      dVar24 = *(double *)((long)__dest_00 + lVar8 * 8 + lVar8 * uVar7 * 8);
      if (ABS(dVar24) < 1e-16) goto LAB_00250d0e;
      dVar23 = 0.0;
      for (lVar16 = 0; lVar8 + lVar16 < (long)(int)uVar10; lVar16 = lVar16 + 1) {
        dVar23 = dVar23 + *(double *)(lVar20 + lVar16 * 8) * pdVar11[lVar16];
      }
      pdVar6[lVar8] = (*(double *)((long)__dest + lVar8 * 8) - dVar23) / dVar24;
      pdVar11 = pdVar11 + -1;
      lVar20 = lVar20 + ~uVar7 * 8;
    }
  }
LAB_00250d10:
  aom_free(__dest);
  aom_free(__dest_00);
  return iVar9;
LAB_00250d0e:
  iVar9 = 0;
  goto LAB_00250d10;
}

Assistant:

static int equation_system_solve(aom_equation_system_t *eqns) {
  const int n = eqns->n;
  double *b = (double *)aom_malloc(sizeof(*b) * n);
  double *A = (double *)aom_malloc(sizeof(*A) * n * n);
  int ret = 0;
  if (A == NULL || b == NULL) {
    fprintf(stderr, "Unable to allocate temp values of size %dx%d\n", n, n);
    aom_free(b);
    aom_free(A);
    return 0;
  }
  memcpy(A, eqns->A, sizeof(*eqns->A) * n * n);
  memcpy(b, eqns->b, sizeof(*eqns->b) * n);
  ret = linsolve(n, A, eqns->n, b, eqns->x);
  aom_free(b);
  aom_free(A);

  if (ret == 0) {
    return 0;
  }
  return 1;
}